

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O1

void __thiscall ParserProbModelXML::ReadObservations(ParserProbModelXML *this)

{
  string *__return_storage_ptr__;
  xmlNodeSetPtr pxVar1;
  __normal_iterator<std::pair<unsigned_int,__xmlNode_*>_*,_std::vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>_>
  __first;
  iterator __last;
  char cVar2;
  _Rb_tree_color _Var3;
  ulong uVar4;
  xmlXPathObjectPtr pxVar5;
  char *__s;
  size_t sVar6;
  xmlNodePtr node;
  ostream *poVar7;
  mapped_type *pmVar8;
  undefined8 *puVar9;
  ParserProbModelXML *pPVar10;
  long lVar11;
  uint AI;
  vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
  parsed_actions;
  string obs_name;
  string parent_name;
  string comment;
  string agent_name;
  stringstream obs_path_ss;
  __normal_iterator<std::pair<unsigned_int,__xmlNode_*>_*,_std::vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>_>
  local_418;
  iterator iStack_410;
  pair<unsigned_int,__xmlNode_*> *local_408;
  ulong local_3f8;
  undefined1 local_3f0 [32];
  xmlXPathObjectPtr local_3d0;
  string local_3c8;
  xmlXPathObjectPtr local_3a8;
  ios_base *local_3a0;
  ios_base *local_398;
  xmlXPathObjectPtr local_390;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>_>_>
  *local_388;
  string local_380;
  undefined1 local_360 [32];
  undefined1 local_340 [16];
  _Base_ptr local_330;
  ios_base aiStack_2c0 [264];
  ParserProbModelXML *local_1b8 [2];
  undefined1 local_1a8 [376];
  
  local_3a8 = GetNodesMatchingExpression
                        (this,(xmlChar *)
                              "/ProbModelXML/ProbNet/Variables/Variable[@timeSlice=\'1\' and @role=\'decision\']"
                         ,(xmlNodePtr)0x0);
  if (local_3a8 == (xmlXPathObjectPtr)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Warning: No action nodes for the second timeslice were found in the target file. There are no observations in the model."
               ,0x78);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    return;
  }
  pxVar1 = local_3a8->nodesetval;
  local_418._M_current = (pair<unsigned_int,__xmlNode_*> *)0x0;
  iStack_410._M_current = (pair<unsigned_int,__xmlNode_*> *)0x0;
  local_408 = (pair<unsigned_int,__xmlNode_*> *)0x0;
  if (0 < pxVar1->nodeNr) {
    lVar11 = 0;
    __return_storage_ptr__ = (string *)(local_360 + 0x20);
    do {
      if (this->_m_agentsInitialized == false) {
LAB_004566eb:
        _Var3 = (_Rb_tree_color)lVar11;
      }
      else {
        uVar4 = (**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                       super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                       super_MultiAgentDecisionProcess + 0x10))();
        if (uVar4 < 2) goto LAB_004566eb;
        pPVar10 = (ParserProbModelXML *)0x509775;
        pxVar5 = GetNodesMatchingExpression(this,"Agent",pxVar1->nodeTab[lVar11]);
        if (pxVar5 == (xmlXPathObjectPtr)0x0) {
          puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
          *puVar9 = &PTR__E_0059bd80;
          puVar9[1] = puVar9 + 3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(puVar9 + 1),"Found an action node with no associated agent.","");
          *puVar9 = &PTR__E_005ce150;
          __cxa_throw(puVar9,&EParse::typeinfo,E::~E);
        }
        GetVariableName_abi_cxx11_(__return_storage_ptr__,pPVar10,*pxVar5->nodesetval->nodeTab);
        _Var3 = MultiAgentDecisionProcess::GetAgentIndexByName
                          ((MultiAgentDecisionProcess *)this->_m_fDecPOMDP,__return_storage_ptr__);
        xmlXPathFreeObject(pxVar5);
        if ((undefined1 *)CONCAT44(local_340._4_4_,local_340._0_4_) != local_340 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_340._4_4_,local_340._0_4_),
                          (ulong)((long)&local_330->_M_color + 1));
        }
      }
      local_340._8_8_ = pxVar1->nodeTab[lVar11];
      local_340._0_4_ = _Var3;
      if (iStack_410._M_current == local_408) {
        std::
        vector<std::pair<unsigned_int,_xmlNode*>,std::allocator<std::pair<unsigned_int,_xmlNode*>>>
        ::_M_realloc_insert<std::pair<unsigned_int,_xmlNode*>>
                  ((vector<std::pair<unsigned_int,_xmlNode*>,std::allocator<std::pair<unsigned_int,_xmlNode*>>>
                    *)&local_418,iStack_410,(pair<unsigned_int,__xmlNode_*> *)__return_storage_ptr__
                  );
      }
      else {
        *(ulong *)iStack_410._M_current = CONCAT44(local_340._4_4_,_Var3);
        (iStack_410._M_current)->second = (_xmlNode *)local_340._8_8_;
        iStack_410._M_current = iStack_410._M_current + 1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pxVar1->nodeNr);
  }
  __last._M_current = iStack_410._M_current;
  __first._M_current = local_418._M_current;
  if (local_418._M_current != iStack_410._M_current) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,_xmlNode*>*,std::vector<std::pair<unsigned_int,_xmlNode*>,std::allocator<std::pair<unsigned_int,_xmlNode*>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<unsigned_int,_xmlNode*>,std::pair<unsigned_int,_xmlNode*>)>>
              (local_418,
               (__normal_iterator<std::pair<unsigned_int,__xmlNode_*>_*,_std::vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>_>
                )iStack_410._M_current,
               (ulong)(uint)((int)LZCOUNT((long)iStack_410._M_current - (long)local_418._M_current
                                          >> 4) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(std::pair<unsigned_int,__xmlNode_*>,_std::pair<unsigned_int,__xmlNode_*>)>
                )0x456eb0);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,_xmlNode*>*,std::vector<std::pair<unsigned_int,_xmlNode*>,std::allocator<std::pair<unsigned_int,_xmlNode*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<unsigned_int,_xmlNode*>,std::pair<unsigned_int,_xmlNode*>)>>
              (__first,(__normal_iterator<std::pair<unsigned_int,__xmlNode_*>_*,_std::vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>_>
                        )__last._M_current,
               (_Iter_comp_iter<bool_(*)(std::pair<unsigned_int,__xmlNode_*>,_std::pair<unsigned_int,__xmlNode_*>)>
                )0x456eb0);
  }
  if (iStack_410._M_current != local_418._M_current) {
    local_388 = &this->_m_parsedElements;
    local_3a0 = (ios_base *)(local_1a8 + 0x70);
    local_398 = aiStack_2c0;
    local_3f8 = 0;
    do {
      poVar7 = (ostream *)(local_340 + 0x10);
      AI = 0;
      if (this->_m_asynchronousModel == false) {
        AI = local_418._M_current[local_3f8].first;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)(local_360 + 0x20));
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"/ProbModelXML/ProbNet/Links/Link/Variable[starts-with(@name, \"",0x3e);
      __s = (char *)xmlGetProp(local_418._M_current[local_3f8].second,"name");
      if (__s == (char *)0x0) {
        std::ios::clear((int)poVar7 + (int)local_330[-1]._M_parent);
      }
      else {
        sVar6 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,__s,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\") and @timeSlice=\'1\']",0x16);
      std::__cxx11::stringbuf::str();
      pPVar10 = local_1b8[0];
      pxVar5 = GetNodesMatchingExpression(this,(xmlChar *)local_1b8[0],(xmlNodePtr)0x0);
      if (local_1b8[0] != (ParserProbModelXML *)local_1a8) {
        pPVar10 = (ParserProbModelXML *)(local_1a8._0_8_ + 1);
        operator_delete(local_1b8[0],(ulong)pPVar10);
      }
      if (pxVar5 != (xmlXPathObjectPtr)0x0) {
        pxVar1 = pxVar5->nodesetval;
        local_390 = pxVar5;
        if (1 < pxVar1->nodeNr) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "Warning: multiple obervation factors for one agent are not yet supported.",
                     0x49);
          cVar2 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
          pPVar10 = (ParserProbModelXML *)(ulong)(uint)(int)cVar2;
          std::ostream::put(-0x50);
          std::ostream::flush();
        }
        node = (xmlNodePtr)xmlFirstElementChild((*pxVar1->nodeTab)->parent);
        GetVariableName_abi_cxx11_(&local_3c8,pPVar10,node);
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"/ProbModelXML/ProbNet/Variables/Variable[(@name=\'",0x31);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_3c8._M_dataplus._M_p,
                            local_3c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' or @name=\'",0xc);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_3c8._M_dataplus._M_p,local_3c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," [1]\') and @timeSlice=\'1\' and @role=\'chance\']",0x2d);
        GetVariableComment_abi_cxx11_(&local_380,this,node);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"/States/State",0xd)
        ;
        std::__cxx11::stringbuf::str();
        pPVar10 = (ParserProbModelXML *)local_3f0._0_8_;
        local_3d0 = GetNodesMatchingExpression(this,(xmlChar *)local_3f0._0_8_,(xmlNodePtr)0x0);
        if ((ParserProbModelXML *)local_3f0._0_8_ != (ParserProbModelXML *)(local_3f0 + 0x10)) {
          pPVar10 = (ParserProbModelXML *)(local_3f0._16_8_ + 1);
          operator_delete((void *)local_3f0._0_8_,(ulong)pPVar10);
        }
        if (local_3d0 != (xmlXPathObjectPtr)0x0) {
          pxVar1 = local_3d0->nodesetval;
          if (0 < pxVar1->nodeNr) {
            lVar11 = 0;
            do {
              GetVariableName_abi_cxx11_((string *)local_3f0,pPVar10,pxVar1->nodeTab[lVar11]);
              pPVar10 = (ParserProbModelXML *)(ulong)AI;
              MADPComponentDiscreteObservations::AddObservation
                        (&(this->_m_fDecPOMDP->super_MultiAgentDecisionProcessDiscreteFactoredStates
                          )._m_O,AI,(string *)local_3f0,&local_380);
              GetVariableName_abi_cxx11_((string *)local_360,pPVar10,node);
              pPVar10 = (ParserProbModelXML *)local_360;
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>_>_>
                       ::operator[](local_388,(key_type *)local_360);
              pmVar8->first = OBSERVATION;
              pmVar8->second = AI;
              if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
                pPVar10 = (ParserProbModelXML *)(local_360._16_8_ + 1);
                operator_delete((void *)local_360._0_8_,(ulong)pPVar10);
              }
              if ((ParserProbModelXML *)local_3f0._0_8_ != (ParserProbModelXML *)(local_3f0 + 0x10))
              {
                pPVar10 = (ParserProbModelXML *)(local_3f0._16_8_ + 1);
                operator_delete((void *)local_3f0._0_8_,(ulong)pPVar10);
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < pxVar1->nodeNr);
          }
          xmlXPathFreeObject(local_3d0);
        }
        xmlXPathFreeObject(local_390);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_3a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_360 + 0x20));
      std::ios_base::~ios_base(local_398);
      local_3f8 = local_3f8 + 1;
    } while (local_3f8 < (ulong)((long)iStack_410._M_current - (long)local_418._M_current >> 4));
  }
  xmlXPathFreeObject(local_3a8);
  MADPComponentDiscreteObservations::SetInitialized
            (&(this->_m_fDecPOMDP->super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_O,true)
  ;
  if (local_418._M_current != (pair<unsigned_int,__xmlNode_*> *)0x0) {
    operator_delete(local_418._M_current,(long)local_408 - (long)local_418._M_current);
  }
  return;
}

Assistant:

void ParserProbModelXML::ReadObservations()
{
    if(DEBUG_PARSE)
    {
        cout << " --- Now Parsing Observations ---" << endl;
    }
    xmlChar *xpath = (xmlChar*) "/ProbModelXML/ProbNet/Variables/Variable[@timeSlice='1' and @role='decision']";
    xmlXPathObjectPtr action_nodes = GetNodesMatchingExpression(xpath);

    if (action_nodes == NULL){
        cout  << "Warning: No action nodes for the second timeslice were found in the target file. There are no observations in the model." << endl;
        return;
    }

    xmlNodeSetPtr action_nodeset = action_nodes->nodesetval;
    vector<pair<Index, xmlNodePtr> > parsed_actions;
    for (int i = 0; i < action_nodeset->nodeNr; i++)
    {
        Index aI;
        if(_m_agentsInitialized && _m_fDecPOMDP->GetNrAgents() > 1)
        {
            xmlXPathObjectPtr agent_node = GetNodesMatchingExpression((xmlChar*) "Agent",action_nodeset->nodeTab[i]);
            if(agent_node == NULL)
                throw EParse("Found an action node with no associated agent.");
            
            string agent_name = GetVariableName(agent_node->nodesetval->nodeTab[0]);
            aI = _m_fDecPOMDP->GetAgentIndexByName(agent_name);
            xmlXPathFreeObject (agent_node);
        }
        else
        {
            aI = i;
        }
        parsed_actions.push_back(make_pair(aI, action_nodeset->nodeTab[i]));
    }

    //Observations have to be loaded in agent-wise order
    sort(parsed_actions.begin(), parsed_actions.end(), CompareParsedActions);

    for (size_t i = 0; i < parsed_actions.size(); i++)
    {
        Index aI;
        if(_m_asynchronousModel)
            aI = 0; //asynchronous models are assumed to be centralized, for now.
        else
            aI = parsed_actions[i].first;
        //retrieving the nodes which link to each decision node for T+1
        stringstream link_path_ss;
        link_path_ss << "/ProbModelXML/ProbNet/Links/Link/Variable[starts-with(@name, \""
                     << (char*) xmlGetProp(parsed_actions[i].second, (xmlChar*) "name")
                     << "\") and @timeSlice='1']";
        xmlXPathObjectPtr link_nodes = GetNodesMatchingExpression((xmlChar*) link_path_ss.str().c_str());

        if(link_nodes != NULL)
        {
            xmlNodeSetPtr link_nodeset = link_nodes->nodesetval;
            if(link_nodeset->nodeNr > 1){
                cout << "Warning: multiple obervation factors for one agent are not yet supported." << endl;
            }
            //For now, it is assumed that the observation model is factored agent-wise - that is, there is no more than one 
            //chance node linked to each decision node in slice T+1. If support for this feature is needed, it should be added here.
            //Each link_nodeset->nodeTab element should represent one of the observation factors of agent i.
            xmlNodePtr parent_node = xmlFirstElementChild(link_nodeset->nodeTab[0]->parent);
            string parent_name =  GetVariableName(parent_node);
            //now we must retrieve the original chance nodes with this name and parse them.
            stringstream obs_path_ss;
            obs_path_ss << "/ProbModelXML/ProbNet/Variables/Variable[(@name='"
                        << parent_name << "' or @name='" << parent_name << " [1]') and @timeSlice='1' and @role='chance']";
            string comment = GetVariableComment(parent_node);
            obs_path_ss << "/States/State";
            xmlXPathObjectPtr obs_nodes = GetNodesMatchingExpression((xmlChar*) obs_path_ss.str().c_str());
            if(obs_nodes != NULL)
            {        
                xmlNodeSetPtr obs_nodeset = obs_nodes->nodesetval;
                for(int j = 0; j < obs_nodeset->nodeNr; j++)
                {
                    string obs_name = GetVariableName(obs_nodeset->nodeTab[j]);
                    _m_fDecPOMDP->AddObservation(aI, obs_name, comment);
                    pair<elm_type, Index> element = make_pair(OBSERVATION, aI);
                    _m_parsedElements[GetVariableName(parent_node)] = element;
                    if(DEBUG_PARSE)
                    {
                        cout << "Added observation: " << obs_name << " to agent " << aI << endl;
                    }
                }
                xmlXPathFreeObject (obs_nodes);
            }
            xmlXPathFreeObject (link_nodes);
        }
    }
    xmlXPathFreeObject (action_nodes);

    _m_fDecPOMDP->SetObservationsInitialized(true);

    return;
}